

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,2,2>
          (MatrixCaseUtils *this,Vector<float,_2> *a,Vector<float,_2> *b)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  float *pfVar4;
  MatrixCaseUtils *pMVar5;
  int col;
  long lVar6;
  bool bVar7;
  undefined4 uVar8;
  Vector<float,_2> VVar9;
  Matrix<float,_2,_2> MVar10;
  Matrix<float,_2,_2> retVal;
  
  pfVar4 = (float *)&retVal;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar8 = 0;
      }
      pfVar4[lVar6 * 2] = (float)uVar8;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar4 = pfVar4 + 1;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  pfVar4 = (float *)&retVal;
  lVar3 = 0;
  do {
    fVar1 = b->m_data[lVar3];
    lVar6 = 0;
    do {
      pfVar4[lVar6 * 2] = a->m_data[lVar6] * fVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pfVar4 = pfVar4 + 1;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar3 = 0;
  pMVar5 = this;
  do {
    lVar6 = 0;
    do {
      VVar9.m_data[0] = 1.0;
      VVar9.m_data[1] = 0.0;
      if (lVar3 != lVar6) {
        VVar9.m_data[0] = 0.0;
        VVar9.m_data[1] = 0.0;
      }
      *(float *)(pMVar5 + lVar6 * 8) = VVar9.m_data[0];
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    pMVar5 = pMVar5 + 4;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  pfVar4 = (float *)&retVal;
  lVar3 = 0;
  do {
    lVar6 = 0;
    do {
      uVar2 = (uint)pfVar4[lVar6 * 2];
      *(uint *)(this + lVar6 * 4) = uVar2;
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    this = this + 8;
    pfVar4 = pfVar4 + 1;
    bVar7 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar7);
  MVar10.m_data.m_data[0].m_data[1] = 0.0;
  MVar10.m_data.m_data[0].m_data[0] = (float)uVar2;
  MVar10.m_data.m_data[1].m_data[0] = VVar9.m_data[0];
  MVar10.m_data.m_data[1].m_data[1] = VVar9.m_data[1];
  return (Matrix<float,_2,_2>)MVar10.m_data.m_data;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}